

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::
Attr_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval_internal
          (Attr_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
          ,Dispatch_State *t_ss)

{
  const_reference pvVar1;
  pointer pAVar2;
  Dispatch_Engine *this_00;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  name_conflict_error *e;
  anon_class_32_1_15d86eb9_for_m_f local_c0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_60 [8];
  string attr_name;
  string class_name;
  Dispatch_State *t_ss_local;
  Attr_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this_local;
  
  pvVar1 = std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,0);
  pAVar2 = std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           ::operator->(pvVar1);
  std::__cxx11::string::string
            ((string *)(attr_name.field_2._M_local_buf + 8),&(pAVar2->super_AST_Node).text);
  pvVar1 = std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,1);
  pAVar2 = std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           ::operator->(pvVar1);
  std::__cxx11::string::string((string *)local_60,&(pAVar2->super_AST_Node).text);
  this_00 = chaiscript::detail::Dispatch_State::operator->(in_RDX);
  std::__cxx11::string::string
            ((string *)&local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  fun<chaiscript::eval::Attr_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::dispatch::Dynamic_Object&)_1_>
            ((chaiscript *)&local_a0,&local_c0);
  std::
  make_shared<chaiscript::dispatch::detail::Dynamic_Object_Function,std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,bool>
            (&local_90,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)((long)&attr_name.field_2 + 8)
             ,(bool *)&local_a0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::
  shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function,void>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_90.field_2,
             (shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function> *)&local_90);
  pvVar1 = std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,1);
  pAVar2 = std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           ::operator->(pvVar1);
  chaiscript::detail::Dispatch_Engine::add
            (this_00,(Proxy_Function *)&local_90.field_2,&(pAVar2->super_AST_Node).text);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_90.field_2);
  std::shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function> *)&local_90);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_a0);
  const::{lambda(chaiscript::dispatch::Dynamic_Object&)#1}::~Dynamic_Object
            ((_lambda_chaiscript__dispatch__Dynamic_Object___1_ *)&local_c0);
  std::__cxx11::string::~string((string *)local_60);
  void_var();
  std::__cxx11::string::~string((string *)(attr_name.field_2._M_local_buf + 8));
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        std::string class_name = this->children[0]->text;

        try {
          std::string attr_name = this->children[1]->text;

          t_ss->add(std::make_shared<dispatch::detail::Dynamic_Object_Function>(std::move(class_name),
                                                                                fun([attr_name](dispatch::Dynamic_Object &t_obj) {
                                                                                  return t_obj.get_attr(attr_name);
                                                                                }),
                                                                                true

                                                                                ),
                    this->children[1]->text);
        } catch (const exception::name_conflict_error &e) {
          throw exception::eval_error("Attribute redefined '" + e.name() + "'");
        }
        return void_var();
      }